

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void printReads(ostream *outfile,deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *reads
               ,int doc_haplotypes)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  ostream *poVar5;
  long lVar6;
  reference pbVar7;
  int in_EDX;
  undefined8 in_RSI;
  ostream *in_RDI;
  uint i_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_3;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  int haplo2counter_1;
  int haplo1counter_1;
  AlignmentRecord **r_2;
  iterator __end4_1;
  iterator __begin4_1;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *__range4_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names_1;
  uint i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_1;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  int haplo5counter;
  int haplo4counter;
  int haplo3counter;
  int haplo2counter;
  int haplo1counter;
  AlignmentRecord **r_1;
  iterator __end3;
  iterator __begin3;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  uint i;
  uint abs_number_reads;
  AlignmentRecord **r;
  iterator __end2;
  iterator __begin2;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *__range2;
  anon_class_1_0_00000001 comp;
  ShortDnaSequence *in_stack_fffffffffffffc58;
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
  *in_stack_fffffffffffffc60;
  ostream *in_stack_fffffffffffffc68;
  ostream *in_stack_fffffffffffffc70;
  AlignmentRecord *in_stack_fffffffffffffca8;
  uint local_24c;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  undefined1 *local_230;
  int local_228;
  int local_224;
  reference local_208;
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_1e0;
  undefined8 local_1c0;
  undefined1 local_1b8 [28];
  uint local_19c;
  reference local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  undefined1 *local_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  reference local_140;
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_118;
  undefined8 local_f8;
  undefined1 local_f0 [28];
  uint local_d4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  uint local_b4;
  reference local_b0;
  _Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> local_88;
  undefined8 local_68;
  undefined1 local_58 [32];
  undefined1 local_38 [36];
  int local_14;
  undefined8 local_10;
  ostream *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
            ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
             in_stack_fffffffffffffc58);
  std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
            ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
             in_stack_fffffffffffffc58);
  std::
  sort<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>
            (local_38,local_58);
  std::ios_base::precision((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),5);
  std::ostream::operator<<(local_8,std::fixed);
  if (local_14 == 0) {
    local_68 = local_10;
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
              ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               in_stack_fffffffffffffc58);
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
              ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               in_stack_fffffffffffffc58);
    while (bVar1 = std::operator!=(in_stack_fffffffffffffc60,(_Self *)in_stack_fffffffffffffc58),
          bVar1) {
      local_b0 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
                 operator*(&local_88);
      AlignmentRecord::getReadNames_abi_cxx11_(in_stack_fffffffffffffca8);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc70);
      local_b4 = (uint)sVar4;
      poVar5 = std::operator<<(local_8,">");
      std::operator<<(poVar5,(string *)*local_b0);
      if (((*local_b0)->single_end & 1U) == 0) {
        std::operator<<(local_8,"|paired");
      }
      poVar5 = std::operator<<(local_8,"|ht_freq:");
      std::ostream::operator<<(poVar5,(*local_b0)->probability);
      poVar5 = std::operator<<(local_8,"|start1:");
      uVar2 = AlignmentRecord::getStart1(*local_b0);
      std::ostream::operator<<(poVar5,uVar2);
      poVar5 = std::operator<<(local_8,"|end1:");
      uVar2 = AlignmentRecord::getEnd1(*local_b0);
      std::ostream::operator<<(poVar5,uVar2);
      if (((*local_b0)->single_end & 1U) == 0) {
        poVar5 = std::operator<<(local_8,"|start2:");
        uVar2 = AlignmentRecord::getStart2(*local_b0);
        std::ostream::operator<<(poVar5,uVar2);
        poVar5 = std::operator<<(local_8,"|end2:");
        uVar2 = AlignmentRecord::getEnd2(*local_b0);
        std::ostream::operator<<(poVar5,uVar2);
      }
      poVar5 = std::operator<<(local_8,"|#reads:");
      std::ostream::operator<<(poVar5,local_b4);
      poVar5 = std::operator<<(local_8,"|#strand:");
      bVar1 = AlignmentRecord::isStrand1(*local_b0);
      std::ostream::operator<<(poVar5,bVar1);
      std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
      operator<<((ostream *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      if (((*local_b0)->single_end & 1U) == 0) {
        local_d4 = (*local_b0)->end1;
        while (local_d4 = local_d4 + 1, local_d4 < (*local_b0)->start2) {
          std::operator<<(local_8,"N");
        }
        operator<<((ostream *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
      std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                (in_stack_fffffffffffffc60);
    }
  }
  else if (local_14 == 5) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x29514e);
    local_f8 = local_10;
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
              ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               in_stack_fffffffffffffc58);
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
              ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               in_stack_fffffffffffffc58);
    while (bVar1 = std::operator!=(in_stack_fffffffffffffc60,(_Self *)in_stack_fffffffffffffc58),
          bVar1) {
      local_140 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
                  operator*(&local_118);
      AlignmentRecord::getReadNames_abi_cxx11_(in_stack_fffffffffffffca8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc70,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc70);
      local_168 = 0;
      local_16c = 0;
      local_170 = 0;
      local_174 = 0;
      local_178 = 0;
      poVar5 = std::operator<<(local_8,">");
      std::operator<<(poVar5,(string *)*local_140);
      if (((*local_140)->single_end & 1U) == 0) {
        if (((*local_140)->single_end & 1U) == 0) {
          uVar2 = AlignmentRecord::getEnd1(*local_140);
          uVar3 = AlignmentRecord::getStart2(*local_140);
          if (uVar2 + 1 < uVar3) {
            std::operator<<(local_8,"|paired");
            poVar5 = std::operator<<(local_8,"|ht_freq:");
            std::ostream::operator<<(poVar5,(*local_140)->probability);
            poVar5 = std::operator<<(local_8,"|start1:");
            uVar2 = AlignmentRecord::getStart1(*local_140);
            std::ostream::operator<<(poVar5,uVar2);
            poVar5 = std::operator<<(local_8,"|end1:");
            uVar2 = AlignmentRecord::getEnd1(*local_140);
            std::ostream::operator<<(poVar5,uVar2);
            poVar5 = std::operator<<(local_8,"|start2:");
            uVar2 = AlignmentRecord::getStart2(*local_140);
            std::ostream::operator<<(poVar5,uVar2);
            poVar5 = std::operator<<(local_8,"|end2:");
            uVar2 = AlignmentRecord::getEnd2(*local_140);
            std::ostream::operator<<(poVar5,uVar2);
            goto LAB_00295630;
          }
        }
        if (((*local_140)->single_end & 1U) == 0) {
          uVar2 = AlignmentRecord::getEnd1(*local_140);
          uVar3 = AlignmentRecord::getStart2(*local_140);
          if (uVar2 + 1 == uVar3) {
            poVar5 = std::operator<<(local_8,"|ht_freq:");
            std::ostream::operator<<(poVar5,(*local_140)->probability);
            poVar5 = std::operator<<(local_8,"|start1:");
            uVar2 = AlignmentRecord::getStart1(*local_140);
            std::ostream::operator<<(poVar5,uVar2);
            poVar5 = std::operator<<(local_8,"|end1:");
            uVar2 = AlignmentRecord::getEnd2(*local_140);
            std::ostream::operator<<(poVar5,uVar2);
          }
        }
      }
      else {
        poVar5 = std::operator<<(local_8,"|ht_freq:");
        std::ostream::operator<<(poVar5,(*local_140)->probability);
        poVar5 = std::operator<<(local_8,"|start1:");
        uVar2 = AlignmentRecord::getStart1(*local_140);
        std::ostream::operator<<(poVar5,uVar2);
        poVar5 = std::operator<<(local_8,"|end1:");
        uVar2 = AlignmentRecord::getEnd1(*local_140);
        std::ostream::operator<<(poVar5,uVar2);
      }
LAB_00295630:
      local_180 = local_f0;
      local_188._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc58);
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc58);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc60,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc58), bVar1) {
        local_198 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_188);
        lVar6 = std::__cxx11::string::find((char *)local_198,0x30663d);
        if (lVar6 == -1) {
          lVar6 = std::__cxx11::string::find((char *)local_198,0x306645);
          if (lVar6 == -1) {
            lVar6 = std::__cxx11::string::find((char *)local_198,0x30664d);
            if (lVar6 == -1) {
              lVar6 = std::__cxx11::string::find((char *)local_198,0x306655);
              if (lVar6 == -1) {
                lVar6 = std::__cxx11::string::find((char *)local_198,0x30665d);
                if (lVar6 != -1) {
                  local_178 = local_178 + 1;
                }
              }
              else {
                local_174 = local_174 + 1;
              }
            }
            else {
              local_170 = local_170 + 1;
            }
          }
          else {
            local_16c = local_16c + 1;
          }
        }
        else {
          local_168 = local_168 + 1;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_188);
      }
      poVar5 = std::operator<<(local_8,"|ht1:");
      std::ostream::operator<<(poVar5,local_168);
      poVar5 = std::operator<<(local_8,"|ht2:");
      std::ostream::operator<<(poVar5,local_16c);
      poVar5 = std::operator<<(local_8,"|ht3:");
      std::ostream::operator<<(poVar5,local_170);
      poVar5 = std::operator<<(local_8,"|ht4:");
      std::ostream::operator<<(poVar5,local_174);
      poVar5 = std::operator<<(local_8,"|ht5:");
      std::ostream::operator<<(poVar5,local_178);
      std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
      operator<<((ostream *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      if (((*local_140)->single_end & 1U) == 0) {
        local_19c = (*local_140)->end1;
        while (local_19c = local_19c + 1, local_19c < (*local_140)->start2) {
          std::operator<<(local_8,"N");
        }
        operator<<((ostream *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
      std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                (in_stack_fffffffffffffc60);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc70);
  }
  else if (local_14 == 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x2959d9);
    local_1c0 = local_10;
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::begin
              ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               in_stack_fffffffffffffc58);
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::end
              ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
               in_stack_fffffffffffffc58);
    while (bVar1 = std::operator!=(in_stack_fffffffffffffc60,(_Self *)in_stack_fffffffffffffc58),
          bVar1) {
      local_208 = std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::
                  operator*(&local_1e0);
      AlignmentRecord::getReadNames_abi_cxx11_(in_stack_fffffffffffffca8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc70,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc70);
      local_224 = 0;
      local_228 = 0;
      poVar5 = std::operator<<(local_8,">");
      std::operator<<(poVar5,(string *)*local_208);
      if (((*local_208)->single_end & 1U) == 0) {
        if (((*local_208)->single_end & 1U) == 0) {
          uVar2 = AlignmentRecord::getEnd1(*local_208);
          uVar3 = AlignmentRecord::getStart2(*local_208);
          if (uVar2 + 1 < uVar3) {
            std::operator<<(local_8,"|paired");
            poVar5 = std::operator<<(local_8,"|ht_freq:");
            std::ostream::operator<<(poVar5,(*local_208)->probability);
            in_stack_fffffffffffffca8 = (AlignmentRecord *)std::operator<<(local_8,"|start1:");
            uVar2 = AlignmentRecord::getStart1(*local_208);
            std::ostream::operator<<(in_stack_fffffffffffffca8,uVar2);
            poVar5 = std::operator<<(local_8,"|end1:");
            uVar2 = AlignmentRecord::getEnd1(*local_208);
            std::ostream::operator<<(poVar5,uVar2);
            poVar5 = std::operator<<(local_8,"|start2:");
            uVar2 = AlignmentRecord::getStart2(*local_208);
            std::ostream::operator<<(poVar5,uVar2);
            poVar5 = std::operator<<(local_8,"|end2:");
            uVar2 = AlignmentRecord::getEnd2(*local_208);
            std::ostream::operator<<(poVar5,uVar2);
            goto LAB_00295e4c;
          }
        }
        if (((*local_208)->single_end & 1U) == 0) {
          uVar2 = AlignmentRecord::getEnd1(*local_208);
          uVar3 = AlignmentRecord::getStart2(*local_208);
          if (uVar2 + 1 == uVar3) {
            poVar5 = std::operator<<(local_8,"|ht_freq:");
            std::ostream::operator<<(poVar5,(*local_208)->probability);
            poVar5 = std::operator<<(local_8,"|start1:");
            uVar2 = AlignmentRecord::getStart1(*local_208);
            std::ostream::operator<<(poVar5,uVar2);
            in_stack_fffffffffffffc70 = std::operator<<(local_8,"|end1:");
            uVar2 = AlignmentRecord::getEnd2(*local_208);
            std::ostream::operator<<(in_stack_fffffffffffffc70,uVar2);
          }
        }
      }
      else {
        poVar5 = std::operator<<(local_8,"|ht_freq:");
        std::ostream::operator<<(poVar5,(*local_208)->probability);
        poVar5 = std::operator<<(local_8,"|start1:");
        uVar2 = AlignmentRecord::getStart1(*local_208);
        std::ostream::operator<<(poVar5,uVar2);
        poVar5 = std::operator<<(local_8,"|end1:");
        uVar2 = AlignmentRecord::getEnd1(*local_208);
        std::ostream::operator<<(poVar5,uVar2);
      }
LAB_00295e4c:
      local_230 = local_1b8;
      local_238._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc58);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc60,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc58), bVar1) {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_238);
        lVar6 = std::__cxx11::string::find((char *)pbVar7,0x306683);
        if (lVar6 == -1) {
          lVar6 = std::__cxx11::string::find((char *)pbVar7,0x30668a);
          if (lVar6 != -1) {
            local_228 = local_228 + 1;
          }
        }
        else {
          local_224 = local_224 + 1;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_238);
      }
      in_stack_fffffffffffffc68 = std::operator<<(local_8,"|ht1:");
      std::ostream::operator<<(in_stack_fffffffffffffc68,local_224);
      in_stack_fffffffffffffc60 =
           (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
           std::operator<<(local_8,"|ht2:");
      std::ostream::operator<<(in_stack_fffffffffffffc60,local_228);
      std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
      operator<<((ostream *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      if (((*local_208)->single_end & 1U) == 0) {
        local_24c = (*local_208)->end1;
        while (local_24c = local_24c + 1, local_24c < (*local_208)->start2) {
          std::operator<<(local_8,"N");
        }
        operator<<((ostream *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
      std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                (in_stack_fffffffffffffc60);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc70);
  }
  return;
}

Assistant:

void printReads(std::ostream& outfile, std::deque<AlignmentRecord*>& reads, int doc_haplotypes) {
    auto comp = [](AlignmentRecord* al1, AlignmentRecord* al2) { return al1->probability > al2->probability; };
    std::sort(reads.begin(), reads.end(), comp);

    outfile.precision(5);
    outfile << std::fixed;


    if (doc_haplotypes == 0){
        for (auto&& r : reads) {
            unsigned int abs_number_reads = r->getReadNames().size();
            outfile << ">" <<r->name;
            if (not r->single_end) outfile << "|paired";
            outfile << "|ht_freq:" << r->probability;
            outfile << "|start1:" << r->getStart1();
            outfile << "|end1:" << r->getEnd1();
            if (not r->single_end){
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            outfile << "|#reads:" << abs_number_reads;
            outfile << "|#strand:" << r->isStrand1();
            outfile << endl;

            outfile << r->sequence1;
            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    } else if(doc_haplotypes == 5) {
        std::vector<std::string> names;
        for (auto&& r : reads) {
            names = r->getReadNames();
            int haplo1counter = 0;
            int haplo2counter = 0;
            int haplo3counter = 0;
            int haplo4counter = 0;
            int haplo5counter = 0;
            outfile << ">" << r->name;

            if(r->single_end){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
            }
            else if(!r->single_end && (r->getEnd1()+1 < r->getStart2())){
                outfile << "|paired";
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            else if (!r->single_end && (r->getEnd1()+1 == r->getStart2())){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd2();
            }
            for(auto& i: names){
                 if (i.find("mutant1") != std::string::npos){
                    haplo1counter++;
                 } else if (i.find("mutant2") != std::string::npos) {
                    haplo2counter++;
                 } else if (i.find("mutant3") != std::string::npos) {
                    haplo3counter++;
                 } else if (i.find("mutant4") != std::string::npos) {
                    haplo4counter++;
                 } else if (i.find("mutant5") != std::string::npos) {
                    haplo5counter++;
                 }
            }
            outfile << "|ht1:" << haplo1counter;
            outfile << "|ht2:" << haplo2counter;
            outfile << "|ht3:" << haplo3counter;
            outfile << "|ht4:" << haplo4counter;
            outfile << "|ht5:" << haplo5counter;
            outfile << endl;

            outfile << r->sequence1;

            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    } else if(doc_haplotypes == 2){
        std::vector<std::string> names;
        for (auto&& r : reads) {
            names = r->getReadNames();
            int haplo1counter = 0;
            int haplo2counter = 0;
            outfile << ">" << r->name;

            if(r->single_end){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
            }
            else if(!r->single_end && (r->getEnd1()+1 < r->getStart2())){
                outfile << "|paired";
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            else if (!r->single_end && (r->getEnd1()+1 == r->getStart2())){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd2();
            }
            for(auto& i: names){
                 if (i.find("normal") != std::string::npos){
                    haplo1counter++;
                 } else if (i.find("mutant") != std::string::npos) {
                    haplo2counter++;
                 }
            }
            outfile << "|ht1:" << haplo1counter;
            outfile << "|ht2:" << haplo2counter;
            outfile << endl;

            outfile << r->sequence1;

            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    }
}